

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O3

void __thiscall rtosc::AutomationMgr::clearSlot(AutomationMgr *this,int slot_id)

{
  AutomationSlot *pAVar1;
  ulong uVar2;
  int *piVar3;
  int sub;
  
  uVar2 = (ulong)(uint)this->nslots;
  if (-1 < slot_id && slot_id < this->nslots) {
    pAVar1 = this->slots;
    pAVar1[(uint)slot_id].active = false;
    pAVar1[(uint)slot_id].used = false;
    if (pAVar1[(uint)slot_id].learning != 0) {
      this->learn_queue_len = this->learn_queue_len + -1;
    }
    piVar3 = &pAVar1->learning;
    do {
      if (pAVar1[(uint)slot_id].learning < *piVar3) {
        *piVar3 = *piVar3 + -1;
      }
      piVar3 = piVar3 + 0x28;
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    pAVar1[(uint)slot_id].learning = -1;
    pAVar1[(uint)slot_id].midi_cc = -1;
    pAVar1[(uint)slot_id].midi_nrpn = -1;
    sub = 0;
    memset(&pAVar1[(uint)slot_id].current_state,0,0x84);
    snprintf(pAVar1[(uint)slot_id].name,0x80,"Slot %d",(ulong)(slot_id + 1));
    if (0 < this->per_slot) {
      do {
        clearSlotSub(this,slot_id,sub);
        sub = sub + 1;
      } while (sub < this->per_slot);
    }
    this->damaged = 1;
  }
  return;
}

Assistant:

void AutomationMgr::clearSlot(int slot_id)
{
    if(slot_id >= nslots || slot_id < 0)
        return;
    auto &s = slots[slot_id];
    s.active = false;
    s.used   = false;
    if(s.learning)
        learn_queue_len--;
    for(int i=0; i<nslots; ++i)
        if(slots[i].learning > s.learning)
            slots[i].learning--;
    s.learning = -1;
    s.midi_cc  = -1;
    s.midi_nrpn  = -1;
    s.current_state = 0;
    memset(s.name, 0, sizeof(s.name));
    snprintf(s.name, sizeof(s.name), "Slot %d", slot_id + 1);
    for(int i=0; i<per_slot; ++i)
        clearSlotSub(slot_id, i);
    damaged = true;
}